

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_map_set(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  int iVar1;
  JSMapState *s;
  int64_t iVar2;
  JSValueUnion JVar3;
  list_head *plVar4;
  list_head *plVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  JSRefCountHeader *p_2;
  JSMapRecord *pJVar9;
  int *piVar10;
  list_head *plVar11;
  list_head *plVar12;
  uint uVar13;
  int64_t iVar14;
  int64_t extraout_RDX;
  ulong uVar15;
  list_head *plVar16;
  JSObject *p;
  JSValueUnion JVar17;
  JSValueUnion JVar18;
  JSRefCountHeader *p_3;
  ulong uVar19;
  JSValue v;
  JSValue key;
  JSValue key_00;
  JSValue JVar20;
  JSValue key_01;
  size_t slack;
  ulong local_70;
  int64_t local_60;
  ulong local_40;
  ulong local_38;
  
  iVar14 = this_val.tag;
  JVar17 = this_val.u;
  if ((((int)this_val.tag == -1) && (magic + 0x1fU == (uint)*(ushort *)((long)JVar17.ptr + 6))) &&
     (s = *(JSMapState **)((long)JVar17.ptr + 0x30), s != (JSMapState *)0x0)) {
    JVar18 = (JSValueUnion)argv->tag;
    JVar3.ptr = (argv->u).ptr;
    if (((ulong)(argv->u).ptr & 0x7fffffffffffffff) == 0 && (argv->tag & 0xffffffffU) == 7) {
      JVar18.float64 = 0.0;
      JVar3.float64 = 0.0;
    }
    if ((s->is_weak == 0) || (JVar18.int32 == 0xffffffff)) {
      if ((magic & 1U) == 0) {
        local_60 = argv[1].tag;
        local_40 = (ulong)argv[1].u.ptr & 0xffffffff;
        local_70 = (ulong)argv[1].u.ptr & 0xffffffff00000000;
      }
      else {
        local_60 = 3;
        local_40 = 0;
        local_70 = 0;
      }
      key_01.tag = (int64_t)JVar18.ptr;
      key_01.u.ptr = JVar3.ptr;
      pJVar9 = map_find_record(ctx,s,key_01);
      if (pJVar9 == (JSMapRecord *)0x0) {
        pJVar9 = (JSMapRecord *)js_malloc(ctx,0x58);
        if (pJVar9 == (JSMapRecord *)0x0) goto LAB_00144ed8;
        pJVar9->ref_count = 1;
        pJVar9->empty = 0;
        pJVar9->map = s;
        if (s->is_weak == 0) {
          if (0xfffffff4 < (uint)JVar18.int32) {
            *(int *)JVar3.ptr = *JVar3.ptr + 1;
          }
        }
        else {
          pJVar9->next_weak_ref = *(JSMapRecord **)((long)JVar3.ptr + 0x28);
          *(JSMapRecord **)((long)JVar3.ptr + 0x28) = pJVar9;
        }
        (pJVar9->key).u.ptr = (void *)JVar3;
        (pJVar9->key).tag = (int64_t)JVar18;
        key.tag = extraout_RDX;
        key.u.float64 = JVar18.float64;
        uVar6 = map_hash_key((JSContext *)JVar3.ptr,key);
        uVar7 = s->hash_size;
        uVar13 = uVar7 - 1 & uVar6;
        plVar11 = s->hash_table;
        plVar4 = plVar11[uVar13].prev;
        plVar4->next = &pJVar9->hash_link;
        (pJVar9->hash_link).prev = plVar4;
        (pJVar9->hash_link).next = plVar11 + uVar13;
        plVar11[uVar13].prev = &pJVar9->hash_link;
        plVar4 = &s->records;
        plVar16 = (s->records).prev;
        plVar16->next = &pJVar9->link;
        (pJVar9->link).prev = plVar16;
        (pJVar9->link).next = plVar4;
        (s->records).prev = &pJVar9->link;
        uVar13 = s->record_count + 1;
        s->record_count = uVar13;
        if (s->record_count_threshold <= uVar13) {
          uVar15 = 4;
          if (uVar7 != 1) {
            uVar15 = (ulong)(uVar7 * 2);
          }
          plVar11 = (list_head *)js_realloc2(ctx,plVar11,uVar15 << 4,&local_38);
          if (plVar11 != (list_head *)0x0) {
            uVar13 = (int)uVar15 + (int)(local_38 >> 4);
            plVar16 = (list_head *)(ulong)uVar13;
            if (uVar13 != 0) {
              uVar15 = (ulong)uVar13;
              plVar12 = plVar11;
              do {
                plVar12->prev = plVar12;
                plVar12->next = plVar12;
                plVar12 = plVar12 + 1;
                uVar15 = uVar15 - 1;
              } while (uVar15 != 0);
            }
            plVar12 = (s->records).next;
            if (plVar12 != plVar4) {
              do {
                if (*(int *)((long)&plVar12[-2].next + 4) == 0) {
                  key_00.tag = (int64_t)plVar16;
                  key_00.u = (JSValueUnion)(JSValueUnion)plVar12[2].next;
                  uVar7 = map_hash_key((JSContext *)plVar12[2].prev,key_00);
                  uVar8 = uVar7 & uVar13 - 1;
                  plVar16 = plVar11 + uVar8;
                  plVar5 = plVar11[uVar8].prev;
                  plVar5->next = plVar12 + 1;
                  plVar12[1].prev = plVar5;
                  plVar12[1].next = plVar16;
                  plVar11[uVar8].prev = plVar12 + 1;
                }
                plVar12 = plVar12->next;
              } while (plVar12 != plVar4);
            }
            s->hash_table = plVar11;
            s->hash_size = uVar13;
            s->record_count_threshold = uVar13 * 2;
          }
        }
      }
      else {
        iVar2 = (pJVar9->value).tag;
        if (0xfffffff4 < (uint)iVar2) {
          JVar3 = (JSValueUnion)(pJVar9->value).u.ptr;
          iVar1 = *JVar3.ptr;
          *(int *)JVar3.ptr = iVar1 + -1;
          if (iVar1 < 2) {
            v.tag = iVar2;
            v.u.ptr = JVar3.ptr;
            __JS_FreeValueRT(ctx->rt,v);
          }
        }
      }
      piVar10 = (int *)(local_70 | local_40);
      if (0xfffffff4 < (uint)local_60) {
        *piVar10 = *piVar10 + 1;
      }
      (pJVar9->value).u.ptr = piVar10;
      (pJVar9->value).tag = local_60;
      *(int *)JVar17.ptr = *JVar17.ptr + 1;
      uVar19 = (ulong)JVar17.ptr & 0xffffffff00000000;
      uVar15 = (ulong)JVar17.ptr & 0xffffffff;
      goto LAB_00144edb;
    }
    JS_ThrowTypeError(ctx,"not an object");
  }
  else {
    JS_ThrowTypeErrorInvalidClass(ctx,magic + 0x1fU);
  }
LAB_00144ed8:
  uVar15 = 0;
  iVar14 = 6;
  uVar19 = 0;
LAB_00144edb:
  JVar20.tag = iVar14;
  JVar20.u.ptr = (void *)(uVar15 | uVar19);
  return JVar20;
}

Assistant:

static JSValue js_map_set(JSContext *ctx, JSValueConst this_val,
                          int argc, JSValueConst *argv, int magic)
{
    JSMapState *s = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP + magic);
    JSMapRecord *mr;
    JSValueConst key, value;

    if (!s)
        return JS_EXCEPTION;
    key = map_normalize_key(ctx, argv[0]);
    if (s->is_weak && !JS_IsObject(key))
        return JS_ThrowTypeErrorNotAnObject(ctx);
    if (magic & MAGIC_SET)
        value = JS_UNDEFINED;
    else
        value = argv[1];
    mr = map_find_record(ctx, s, key);
    if (mr) {
        JS_FreeValue(ctx, mr->value);
    } else {
        mr = map_add_record(ctx, s, key);
        if (!mr)
            return JS_EXCEPTION;
    }
    mr->value = JS_DupValue(ctx, value);
    return JS_DupValue(ctx, this_val);
}